

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationRotation
          (ON_AerialPhotoCameraPosition *this,ON_Xform camera_rotation)

{
  double dVar1;
  double local_d0;
  double local_c0;
  double a;
  double c3;
  double s3;
  double c2;
  double s2;
  double c1;
  double s1;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_AerialPhotoCameraPosition *this_local;
  
  memcpy(&this->m_orientation_rotation,&camera_rotation,0x80);
  ON_3dVector::ON_3dVector
            ((ON_3dVector *)&Y.z,camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],
             camera_rotation.m_xform[2][0]);
  ON_3dVector::ON_3dVector
            ((ON_3dVector *)&Z.z,camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],
             camera_rotation.m_xform[2][1]);
  ON_3dVector::ON_3dVector
            ((ON_3dVector *)local_58,camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],
             camera_rotation.m_xform[2][2]);
  (this->m_orientation_right).x = Y.z;
  (this->m_orientation_right).y = X.x;
  (this->m_orientation_right).z = X.y;
  (this->m_orientation_up).x = Z.z;
  (this->m_orientation_up).y = Y.x;
  (this->m_orientation_up).z = Y.y;
  ON_3dVector::operator-((ON_3dVector *)&s1,(ON_3dVector *)local_58);
  (this->m_orientation_direction).x = s1;
  (this->m_orientation_direction).y = local_68;
  (this->m_orientation_direction).z = local_60;
  c2 = (double)local_58;
  dVar1 = -(double)local_58 * (double)local_58 + 1.0;
  if (dVar1 <= 0.0) {
    local_c0 = 0.0;
  }
  else {
    local_c0 = sqrt(dVar1);
  }
  s3 = local_c0;
  if ((ABS(local_c0) <= 2.220446049250313e-16) || (0.9999999999999998 <= ABS((double)local_58))) {
    c2 = (double)(~-(ulong)((double)local_58 < 0.0) & 0x3ff0000000000000 |
                 -(ulong)((double)local_58 < 0.0) & 0xbff0000000000000);
    s3 = 0.0;
  }
  else if ((ABS((double)local_58) <= 2.220446049250313e-16) || (0.9999999999999998 <= ABS(local_c0))
          ) {
    s3 = (double)(~-(ulong)(local_c0 < 0.0) & 0x3ff0000000000000 |
                 -(ulong)(local_c0 < 0.0) & 0xbff0000000000000);
    c2 = 0.0;
  }
  if (s3 <= 0.0) {
    c1 = 0.0;
    s2 = 1.0;
    if ((Y.x != -X.y) || (NAN(Y.x) || NAN(-X.y))) {
      local_d0 = (Y.x - X.y) * 0.5;
    }
    else {
      local_d0 = Y.x;
    }
    a = local_d0;
  }
  else {
    c1 = -Z.x / s3;
    s2 = Z.y / s3;
    a = Y.z / s3;
  }
  dVar1 = atan2(c1,s2);
  (this->m_orientation_angles_radians).x = dVar1;
  dVar1 = atan2(c2,s3);
  (this->m_orientation_angles_radians).y = dVar1;
  dVar1 = atan2(c2,a);
  (this->m_orientation_angles_radians).z = dVar1;
  (this->m_orientation_angles_degrees).x =
       ((this->m_orientation_angles_radians).x * 180.0) / 3.141592653589793;
  (this->m_orientation_angles_degrees).y =
       ((this->m_orientation_angles_radians).y * 180.0) / 3.141592653589793;
  (this->m_orientation_angles_degrees).z =
       ((this->m_orientation_angles_radians).z * 180.0) / 3.141592653589793;
  this->m_status = this->m_status | 2;
  return true;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationRotation(
    ON_Xform camera_rotation
    )
{
  m_orientation_rotation = camera_rotation;

  const ON_3dVector X(camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],camera_rotation.m_xform[2][0]);
  const ON_3dVector Y(camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],camera_rotation.m_xform[2][1]);
  const ON_3dVector Z(camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],camera_rotation.m_xform[2][2]);

  m_orientation_right = X;
  m_orientation_up = Y;
  m_orientation_direction = -Z;

  double s1, c1, s2, c2, s3, c3;

  s2 = Z.x;
  double a = 1.0 - s2*s2;
  c2 = (a > 0.0) ? sqrt(a) : 0.0;
  if ( fabs(c2) <= ON_EPSILON || fabs(s2) >= 1.0-ON_EPSILON )
  {
    s2 = (s2 < 0.0) ? -1.0 : 1.0;
    c2 = 0.0;
  }
  else if ( fabs(s2) <= ON_EPSILON || fabs(c2) >= 1.0-ON_EPSILON )
  {
    c2 = (c2 < 0.0) ? -1.0 : 1.0;
    s2 = 0.0;
  }

  if ( c2 > 0.0 )
  {
    s1 = -Z.y/c2;
    c1 =  Z.z/c2;
    s3 = -Y.x/c2;
    c3 =  X.x/c2;
  }
  else
  {
    s1 = 0.0;
    c1 = 1.0;
    s3 = ( X.y ==  Y.z ) ? X.y : 0.5*(X.y + Y.z);
    c3 = ( Y.y == -X.z ) ? Y.y : 0.5*(Y.y - X.z);
  }

  m_orientation_angles_radians.x = atan2(s1,c1);
  m_orientation_angles_radians.y = atan2(s2,c2);
  m_orientation_angles_radians.z = atan2(s2,c3);

  m_orientation_angles_degrees.x = m_orientation_angles_radians.x*180.0/ON_PI;
  m_orientation_angles_degrees.y = m_orientation_angles_radians.y*180.0/ON_PI;
  m_orientation_angles_degrees.z = m_orientation_angles_radians.z*180.0/ON_PI;

  m_status |= 2;

  return true;
}